

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O2

ctmbstr prvTidytmbsubstrn(ctmbstr s1,uint len1,ctmbstr s2)

{
  uint n;
  int iVar1;
  ctmbstr s1_00;
  long lVar2;
  
  n = prvTidytmbstrlen(s2);
  lVar2 = 0;
  do {
    s1_00 = s1;
    if ((int)(len1 - n) < lVar2) {
      return (ctmbstr)0x0;
    }
    iVar1 = prvTidytmbstrncmp(s1_00,s2,n);
    lVar2 = lVar2 + 1;
    s1 = s1_00 + 1;
  } while (iVar1 != 0);
  return s1_00;
}

Assistant:

ctmbstr TY_(tmbsubstrn)( ctmbstr s1, uint len1, ctmbstr s2 )
{
    uint len2 = TY_(tmbstrlen)(s2);
    int ix, diff = len1 - len2;

    for ( ix = 0; ix <= diff; ++ix )
    {
        if ( TY_(tmbstrncmp)(s1+ix, s2, len2) == 0 )
            return (ctmbstr) s1+ix;
    }
    return NULL;
}